

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O3

void __thiscall
MxxColl_ScatterUnknownSize_Test::~MxxColl_ScatterUnknownSize_Test
          (MxxColl_ScatterUnknownSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, ScatterUnknownSize) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<int> msg1;
    std::vector<int> msg2;
    // scatter from 0
    if (c.rank() == 0) {
        size_t msgsize = 13;
        vec.resize(c.size()*msgsize);
        for (int i = 0; i < c.size(); ++i) {
            for (size_t j = 0; j < msgsize; ++j)
            {
                vec[i*msgsize + j] = -2*j + i;
            }
        }
        // scatter the same thing twice
        msg1 = mxx::scatter(vec, 0);
        msg2 = mxx::scatter(vec, 0, c);
    } else {
        msg1 = mxx::scatter_recv<int>(0, c);
        msg2 = mxx::scatter_recv<int>(0);
    }

    ASSERT_EQ(13, (int)msg1.size());
    ASSERT_EQ(13, (int)msg2.size());
    for (int j = 0; j < 13; ++j) {
        ASSERT_EQ(-2*j+c.rank(), msg1[j]);
        ASSERT_EQ(-2*j+c.rank(), msg2[j]);
    }
}